

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load_node
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          V *values,int num_keys,AlexNode<int,_int> **node,int total_keys,
          LinearModel<int> *data_node_model)

{
  bool bVar1;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *pAVar2;
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *pAVar3;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this_00;
  long *in_RCX;
  int in_EDX;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  double dVar4;
  pair<int,_double> pVar5;
  data_node_type *data_node_1;
  int i;
  LinearModel<int> child_data_node_model;
  double right_boundary;
  double left_boundary;
  double right_value;
  double left_value;
  int repeats;
  model_node_type *child_node;
  FTNode *tree_node;
  iterator __end3;
  iterator __begin3;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *__range3;
  int cur;
  int fanout;
  int max_data_node_keys_1;
  model_node_type *model_node;
  double best_fanout_tree_cost;
  int best_fanout_tree_depth;
  int max_data_node_keys;
  pair<int,_double> best_fanout_stats;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  used_fanout_tree_nodes;
  data_node_type *data_node;
  uint in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  uint in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  uint in_stack_fffffffffffffe18;
  undefined2 in_stack_fffffffffffffe1c;
  short in_stack_fffffffffffffe1e;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_fffffffffffffe20;
  AlexNode<int,_int> *in_stack_fffffffffffffe48;
  AlexNode<int,_int> *node_00;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_fffffffffffffe50;
  LinearModel<int> *in_stack_fffffffffffffe58;
  undefined1 *puVar6;
  undefined8 in_stack_fffffffffffffe60;
  int num_keys_00;
  V *in_stack_fffffffffffffe68;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_fffffffffffffe70;
  int local_144;
  LinearModel<int> local_140;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  int local_110;
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *local_108;
  reference local_100;
  FTNode *local_f8;
  __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  local_f0;
  undefined1 *local_e8;
  int local_e0;
  AlexNode<int,_int> local_d9;
  pair<int,_double> local_b0;
  pair<int,_double> local_98;
  uint local_84;
  pair<int,_double> local_80;
  undefined1 local_70 [48];
  LinearModel<int> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  num_keys_00 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  if (((double)*(int *)(in_RDI + 0x24) * 0.7 < (double)in_EDX) ||
     ((20.0 <= *(double *)(*in_RCX + 0x20) &&
      ((*(double *)(*in_RCX + 0x10) != 0.0 || (NAN(*(double *)(*in_RCX + 0x10)))))))) {
    std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::vector
              ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
               0x109c6b);
    std::pair<int,_double>::pair<int,_double,_true>(&local_80);
    if (*(int *)(in_RDI + 0x98) == 0) {
      in_stack_fffffffffffffe08 = (uint)((double)*(int *)(in_RDI + 0x24) * 0.7);
      in_stack_fffffffffffffe18 = *(byte *)(in_RDI + 0x1d) & 1;
      in_stack_fffffffffffffe10 = *(byte *)(in_RDI + 0x1c) & 1;
      local_84 = in_stack_fffffffffffffe08;
      pVar5 = fanout_tree::find_best_fanout_bottom_up<int,int,alex::AlexCompare>
                        (*(undefined8 *)(in_RDI + 0x10),in_RSI,in_EDX,*in_RCX,in_R8D,local_70,
                         *(undefined4 *)(in_RDI + 0x20));
      local_98.second = pVar5.second;
      local_98.first = pVar5.first;
      std::pair<int,_double>::operator=(&local_80,&local_98);
    }
    else if (*(int *)(in_RDI + 0x98) == 1) {
      in_stack_fffffffffffffe10 = *(byte *)(in_RDI + 0x1d) & 1;
      in_stack_fffffffffffffe08 = *(byte *)(in_RDI + 0x1c) & 1;
      pVar5 = fanout_tree::find_best_fanout_top_down<int,int,alex::AlexCompare>
                        (*(undefined8 *)(in_RDI + 0x10),in_RSI,in_EDX,*in_RCX,in_R8D,local_70,
                         *(undefined4 *)(in_RDI + 0x20));
      in_stack_fffffffffffffe70 =
           (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
           pVar5.second;
      local_b0.first = pVar5.first;
      local_b0.second = (double)in_stack_fffffffffffffe70;
      std::pair<int,_double>::operator=(&local_80,&local_b0);
    }
    local_d9.cost_._1_4_ = local_80.first;
    local_d9._25_8_ = local_80.second;
    if ((local_80.second < *(double *)(*in_RCX + 0x20)) ||
       ((double)*(int *)(in_RDI + 0x24) * 0.7 < (double)in_EDX)) {
      *(int *)(in_RDI + 0x2c) = *(int *)(in_RDI + 0x2c) + 1;
      model_node_allocator
                ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      pAVar3 = __gnu_cxx::
               new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
               ::allocate((new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
                           *)in_stack_fffffffffffffe20,
                          CONCAT26(in_stack_fffffffffffffe1e,
                                   CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)),
                          (void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::AlexModelNode
                ((AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_fffffffffffffe20,in_stack_fffffffffffffe1e,
                 (allocator<std::pair<int,_int>_> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      std::allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
      ~allocator((allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> *
                 )0x109efc);
      local_d9.model_._1_8_ = pAVar3;
      if (local_d9.cost_._1_4_ == 0) {
        dVar4 = log2((double)in_EDX / (double)*(int *)(in_RDI + 0x24));
        local_d9.cost_._1_4_ = (int)dVar4 + 1;
        puVar6 = local_70;
        std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::clear
                  ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
                   0x109f55);
        in_stack_fffffffffffffe08 = (uint)((double)*(int *)(in_RDI + 0x24) * 0.7);
        in_stack_fffffffffffffe18 = *(byte *)(in_RDI + 0x1d) & 1;
        in_stack_fffffffffffffe10 = *(byte *)(in_RDI + 0x1c) & 1;
        local_d9._9_4_ = in_stack_fffffffffffffe08;
        fanout_tree::compute_level<int,int,std::less<int>>
                  (*(undefined8 *)(in_RDI + 0x10),in_RSI,in_EDX,*in_RCX,in_R8D,puVar6,
                   local_d9.cost_._1_4_);
      }
      local_d9._vptr_AlexNode._1_4_ = 1 << (local_d9.cost_._1_4_ & 0x1f);
      (((AlexNode<int,_int> *)local_d9.model_._1_8_)->model_).a_ =
           *(double *)(*in_RCX + 0x10) * (double)local_d9._vptr_AlexNode._1_4_;
      (((AlexNode<int,_int> *)local_d9.model_._1_8_)->model_).b_ =
           *(double *)(*in_RCX + 0x18) * (double)local_d9._vptr_AlexNode._1_4_;
      *(int *)(local_d9.model_._1_8_ + 0x30) = local_d9._vptr_AlexNode._1_4_;
      node_00 = &local_d9;
      pointer_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                         *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      this_00 = (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
                __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                          ((new_allocator<alex::AlexNode<int,_int>_*> *)in_stack_fffffffffffffe20,
                           CONCAT26(in_stack_fffffffffffffe1e,
                                    CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)),
                           (void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      *(Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> **)
       (local_d9.model_._1_8_ + 0x38) = this_00;
      std::allocator<alex::AlexNode<int,_int>_*>::~allocator
                ((allocator<alex::AlexNode<int,_int>_*> *)0x10a0d5);
      local_e0 = 0;
      local_e8 = local_70;
      local_f0._M_current =
           (FTNode *)
           std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::begin
                     ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                       *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_f8 = (FTNode *)
                 std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 ::end((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                        *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                (__normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)),
            bVar1) {
        local_100 = __gnu_cxx::
                    __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
                    ::operator*(&local_f0);
        model_node_allocator
                  ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        pAVar3 = __gnu_cxx::
                 new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
                 ::allocate((new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
                             *)in_stack_fffffffffffffe20,
                            CONCAT26(in_stack_fffffffffffffe1e,
                                     CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)),
                            (void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::AlexModelNode
                  ((AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)
                   in_stack_fffffffffffffe20,in_stack_fffffffffffffe1e,
                   (allocator<std::pair<int,_int>_> *)
                   CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        std::allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
        ~allocator((allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
                    *)0x10a1bd);
        (pAVar3->super_AlexNode<int,_int>).cost_ = local_100->cost;
        (pAVar3->super_AlexNode<int,_int>).duplication_factor_ =
             (char)local_d9.cost_._1_4_ - (char)local_100->level;
        local_110 = 1 << ((pAVar3->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
        local_118 = (double)local_e0 / (double)local_d9._vptr_AlexNode._1_4_;
        local_120 = (double)(local_e0 + local_110) / (double)local_d9._vptr_AlexNode._1_4_;
        local_128 = (local_118 - *(double *)(*in_RCX + 0x18)) / *(double *)(*in_RCX + 0x10);
        local_130 = (local_120 - *(double *)(*in_RCX + 0x18)) / *(double *)(*in_RCX + 0x10);
        (pAVar3->super_AlexNode<int,_int>).model_.a_ = 1.0 / (local_130 - local_128);
        (pAVar3->super_AlexNode<int,_int>).model_.b_ =
             -(pAVar3->super_AlexNode<int,_int>).model_.a_ * local_128;
        (*(AlexNode<int,_int> ***)(local_d9.model_._1_8_ + 0x38))[local_e0] =
             &pAVar3->super_AlexNode<int,_int>;
        local_108 = pAVar3;
        LinearModel<int>::LinearModel(&local_140,local_100->a,local_100->b);
        bulk_load_node(in_RSI,(V *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                       (int)((ulong)in_RCX >> 0x20),
                       (AlexNode<int,_int> **)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                       (int)((ulong)in_R9 >> 0x20),in_stack_ffffffffffffffc0);
        (*(AlexNode<int,_int> ***)(local_d9.model_._1_8_ + 0x38))[local_e0]->duplication_factor_ =
             (char)local_d9.cost_._1_4_ - (char)local_100->level;
        local_144 = local_e0;
        if (((*(AlexNode<int,_int> ***)(local_d9.model_._1_8_ + 0x38))[local_e0]->is_leaf_ & 1U) !=
            0) {
          (*(AlexNode<int,_int> ***)(local_d9.model_._1_8_ + 0x38))[local_e0][4].model_.b_ =
               local_100->expected_avg_search_iterations;
          (*(AlexNode<int,_int> ***)(local_d9.model_._1_8_ + 0x38))[local_e0][4].cost_ =
               local_100->expected_avg_shifts;
        }
        while (local_144 = local_144 + 1, local_144 < local_e0 + local_110) {
          (*(AlexNode<int,_int> ***)(local_d9.model_._1_8_ + 0x38))[local_144] =
               (*(AlexNode<int,_int> ***)(local_d9.model_._1_8_ + 0x38))[local_e0];
        }
        local_e0 = local_110 + local_e0;
        __gnu_cxx::
        __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
        ::operator++(&local_f0);
      }
      delete_node(this_00,node_00);
      *in_RCX = local_d9.model_._1_8_;
    }
    else {
      *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
      data_node_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                           *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      pAVar2 = __gnu_cxx::
               new_allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
               ::allocate((new_allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
                           *)in_stack_fffffffffffffe20,
                          CONCAT26(in_stack_fffffffffffffe1e,
                                   CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)),
                          (void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
      AlexDataNode(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18,
                   (AlexCompare *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (allocator<std::pair<int,_int>_> *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      std::
      allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
      ::~allocator((allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
                    *)0x10a5fa);
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
      bulk_load(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,num_keys_00,
                in_stack_fffffffffffffe58,SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0));
      (pAVar2->super_AlexNode<int,_int>).cost_ = *(double *)(*in_RCX + 0x20);
      delete_node(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      *in_RCX = (long)pAVar2;
    }
    std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::~vector
              ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
               in_stack_fffffffffffffe20);
  }
  else {
    *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
    data_node_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                         *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    pAVar2 = __gnu_cxx::
             new_allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
             ::allocate((new_allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
                         *)in_stack_fffffffffffffe20,
                        CONCAT26(in_stack_fffffffffffffe1e,
                                 CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)),
                        (void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
    AlexDataNode(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18,
                 (AlexCompare *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (allocator<std::pair<int,_int>_> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    std::
    allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
    ::~allocator((allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
                  *)0x109ba6);
    AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,num_keys_00,
               in_stack_fffffffffffffe58,SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0));
    (pAVar2->super_AlexNode<int,_int>).cost_ = *(double *)(*in_RCX + 0x20);
    delete_node(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    *in_RCX = (long)pAVar2;
  }
  return;
}

Assistant:

void bulk_load_node(const V values[], int num_keys, AlexNode<T, P>*& node,
                      int total_keys,
                      const LinearModel<T>* data_node_model = nullptr) {
    // Automatically convert to data node when it is impossible to be better
    // than current cost
    if (num_keys <= derived_params_.max_data_node_slots *
                        data_node_type::kInitDensity_ &&
        (node->cost_ < kNodeLookupsWeight || node->model_.a_ == 0)) {
      stats_.num_data_nodes++;
      auto data_node = new (data_node_allocator().allocate(1))
          data_node_type(node->level_, derived_params_.max_data_node_slots,
                         key_less_, allocator_);
      data_node->bulk_load(values, num_keys, data_node_model,
                           params_.approximate_model_computation);
      data_node->cost_ = node->cost_;
      delete_node(node);
      node = data_node;
      return;
    }

    // Use a fanout tree to determine the best way to divide the key space into
    // child nodes
    std::vector<fanout_tree::FTNode> used_fanout_tree_nodes;
    std::pair<int, double> best_fanout_stats;
    if (experimental_params_.fanout_selection_method == 0) {
      int max_data_node_keys = static_cast<int>(
          derived_params_.max_data_node_slots * data_node_type::kInitDensity_);
      best_fanout_stats = fanout_tree::find_best_fanout_bottom_up<T, P>(
          values, num_keys, node, total_keys, used_fanout_tree_nodes,
          derived_params_.max_fanout, max_data_node_keys,
          params_.expected_insert_frac, params_.approximate_model_computation,
          params_.approximate_cost_computation, key_less_);
    } else if (experimental_params_.fanout_selection_method == 1) {
      best_fanout_stats = fanout_tree::find_best_fanout_top_down<T, P>(
          values, num_keys, node, total_keys, used_fanout_tree_nodes,
          derived_params_.max_fanout, params_.expected_insert_frac,
          params_.approximate_model_computation,
          params_.approximate_cost_computation, key_less_);
    }
    int best_fanout_tree_depth = best_fanout_stats.first;
    double best_fanout_tree_cost = best_fanout_stats.second;

    // Decide whether this node should be a model node or data node
    if (best_fanout_tree_cost < node->cost_ ||
        num_keys > derived_params_.max_data_node_slots *
                       data_node_type::kInitDensity_) {
      // Convert to model node based on the output of the fanout tree
      stats_.num_model_nodes++;
      auto model_node = new (model_node_allocator().allocate(1))
          model_node_type(node->level_, allocator_);
      if (best_fanout_tree_depth == 0) {
        // slightly hacky: we assume this means that the node is relatively
        // uniform but we need to split in
        // order to satisfy the max node size, so we compute the fanout that
        // would satisfy that condition
        // in expectation
        best_fanout_tree_depth =
            static_cast<int>(std::log2(static_cast<double>(num_keys) /
                                       derived_params_.max_data_node_slots)) +
            1;
        used_fanout_tree_nodes.clear();
        int max_data_node_keys = static_cast<int>(
            derived_params_.max_data_node_slots * data_node_type::kInitDensity_);
        fanout_tree::compute_level<T, P>(
            values, num_keys, node, total_keys, used_fanout_tree_nodes,
            best_fanout_tree_depth, max_data_node_keys,
            params_.expected_insert_frac, params_.approximate_model_computation,
            params_.approximate_cost_computation);
      }
      int fanout = 1 << best_fanout_tree_depth;
      model_node->model_.a_ = node->model_.a_ * fanout;
      model_node->model_.b_ = node->model_.b_ * fanout;
      model_node->num_children_ = fanout;
      model_node->children_ =
          new (pointer_allocator().allocate(fanout)) AlexNode<T, P>*[fanout];

      // Instantiate all the child nodes and recurse
      int cur = 0;
      for (fanout_tree::FTNode& tree_node : used_fanout_tree_nodes) {
        auto child_node = new (model_node_allocator().allocate(1))
            model_node_type(static_cast<short>(node->level_ + 1), allocator_);
        child_node->cost_ = tree_node.cost;
        child_node->duplication_factor_ =
            static_cast<uint8_t>(best_fanout_tree_depth - tree_node.level);
        int repeats = 1 << child_node->duplication_factor_;
        double left_value = static_cast<double>(cur) / fanout;
        double right_value = static_cast<double>(cur + repeats) / fanout;
        double left_boundary = (left_value - node->model_.b_) / node->model_.a_;
        double right_boundary =
            (right_value - node->model_.b_) / node->model_.a_;
        child_node->model_.a_ = 1.0 / (right_boundary - left_boundary);
        child_node->model_.b_ = -child_node->model_.a_ * left_boundary;
        model_node->children_[cur] = child_node;
        LinearModel<T> child_data_node_model(tree_node.a, tree_node.b);
        bulk_load_node(values + tree_node.left_boundary,
                       tree_node.right_boundary - tree_node.left_boundary,
                       model_node->children_[cur], total_keys,
                       &child_data_node_model);
        model_node->children_[cur]->duplication_factor_ =
            static_cast<uint8_t>(best_fanout_tree_depth - tree_node.level);
        if (model_node->children_[cur]->is_leaf_) {
          static_cast<data_node_type*>(model_node->children_[cur])
              ->expected_avg_exp_search_iterations_ =
              tree_node.expected_avg_search_iterations;
          static_cast<data_node_type*>(model_node->children_[cur])
              ->expected_avg_shifts_ = tree_node.expected_avg_shifts;
        }
        for (int i = cur + 1; i < cur + repeats; i++) {
          model_node->children_[i] = model_node->children_[cur];
        }
        cur += repeats;
      }

      delete_node(node);
      node = model_node;
    } else {
      // Convert to data node
      stats_.num_data_nodes++;
      auto data_node = new (data_node_allocator().allocate(1))
          data_node_type(node->level_, derived_params_.max_data_node_slots,
                         key_less_, allocator_);
      data_node->bulk_load(values, num_keys, data_node_model,
                           params_.approximate_model_computation);
      data_node->cost_ = node->cost_;
      delete_node(node);
      node = data_node;
    }
  }